

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

void __thiscall
nonsugar::detail::
parse_argument<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
::operator()(parse_argument<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
             *this,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *it,
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            last,shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *value,
            argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *arg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  size_type sVar1;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  parse_argument<std::__cxx11::string,std::__cxx11::string,void> local_49;
  __shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  std::make_shared<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_38 = value;
  std::
  __shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&value->
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  if (it->_M_current != last._M_current) {
    do {
      local_48._M_ptr = (element_type *)0x0;
      local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      parse_argument<std::__cxx11::string,std::__cxx11::string,void>::operator()
                (&local_49,it,last,
                 (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,arg,err);
      sVar1 = err->_M_string_length;
      if (sVar1 == 0) {
        container_traits<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
        ::push_back((local_38->
                    super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr,(value_type *)local_48._M_ptr);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    } while ((sVar1 == 0) && (it->_M_current != last._M_current));
  }
  return;
}

Assistant:

void operator()(
        Iterator &it, Iterator last, std::shared_ptr<Value> &value, Argument const &arg,
        String &err) const
    {
        value = std::make_shared<Value>();
        while (it != last) {
            std::shared_ptr<typename container_traits<Value>::value_type> v;
            parse_argument<String, typename container_traits<Value>::value_type>()(
                it, last, v, arg, err);
            if (!err.empty()) return;
            container_traits<Value>::push_back(*value, *v);
        }
    }